

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

AttributeSpecSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::AttributeSpecSyntax,slang::parsing::Token,slang::syntax::EqualsValueClauseSyntax*>
          (BumpAllocator *this,Token *args,EqualsValueClauseSyntax **args_1)

{
  AttributeSpecSyntax *this_00;
  BumpAllocator *in_RDX;
  Token *in_RSI;
  EqualsValueClauseSyntax *in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  this_00 = (AttributeSpecSyntax *)
            allocate(in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  slang::syntax::AttributeSpecSyntax::AttributeSpecSyntax(this_00,*in_RSI,in_stack_ffffffffffffffc8)
  ;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }